

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.hpp
# Opt level: O1

long duckdb::DecimalParquetValueConversion<long,_false>::PlainRead<false>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  long lVar1;
  ulong req_len;
  
  ByteBuffer::available(plain_data,4);
  req_len = (ulong)*(uint *)plain_data->ptr;
  plain_data->len = plain_data->len - 4;
  plain_data->ptr = (data_ptr_t)((long)plain_data->ptr + 4);
  ByteBuffer::available(plain_data,req_len);
  lVar1 = ParquetDecimalUtils::ReadDecimalValue<long>(plain_data->ptr,req_len,reader->column_schema)
  ;
  ByteBuffer::available(plain_data,req_len);
  plain_data->len = plain_data->len - req_len;
  plain_data->ptr = plain_data->ptr + req_len;
  return lVar1;
}

Assistant:

static DUCKDB_PHYSICAL_TYPE PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		idx_t byte_len;
		if (FIXED_LENGTH) {
			byte_len = reader.Schema().type_length;
		} else {
			byte_len = plain_data.read<uint32_t>();
		}
		plain_data.available(byte_len);
		auto res = ParquetDecimalUtils::ReadDecimalValue<DUCKDB_PHYSICAL_TYPE>(const_data_ptr_cast(plain_data.ptr),
		                                                                       byte_len, reader.Schema());

		plain_data.inc(byte_len);
		return res;
	}